

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O3

Mat * preprocessImage(Mat *img,int numRows,int numCols)

{
  long lVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  int in_ECX;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  Mat *pMVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  Mat *cloneImg;
  Mat region;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  countours;
  Mat newImg;
  Rect bnd;
  Mat temp;
  Mat realClone;
  uint local_39c;
  undefined8 local_388;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *pvStack_380;
  Range local_368;
  Mat *local_360;
  undefined8 local_358;
  undefined1 local_308 [16];
  pointer local_2f8;
  undefined8 local_2f0;
  int local_2e8;
  int local_2e4;
  Size local_2e0;
  long *local_2a8;
  int local_290;
  undefined8 local_288;
  int local_280;
  _InputArray local_278 [4];
  Mat local_218 [96];
  undefined8 local_1b8;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *pvStack_1b0;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  _InputArray *local_1a0;
  undefined8 local_198 [12];
  Mat local_138 [96];
  Mat local_d8 [144];
  undefined4 local_48;
  Mat *local_40;
  undefined8 local_38;
  
  pMVar11 = (Mat *)CONCAT44(in_register_00000034,numRows);
  cv::Mat::Mat(local_218);
  if ((int)*(uint *)(pMVar11 + 8) < 1) {
    local_39c = 0xffffffff;
    local_388._0_4_ = -1;
    uVar16 = 0xffffffff;
    iVar5 = -1;
  }
  else {
    uVar10 = *(uint *)(pMVar11 + 8) >> 1;
    iVar15 = -uVar10;
    iVar5 = -1;
    uVar16 = 0xffffffff;
    local_388._0_4_ = -1;
    local_39c = 0xffffffff;
    do {
      if (uVar16 == 0xffffffff) {
        local_2f0._4_4_ = uVar10 + 1;
        local_2f0._0_4_ = uVar10;
        local_368.start = -0x80000000;
        local_368.end = 0x7fffffff;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar11,(Range *)&local_2f0,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        local_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_2f0);
        if (((double)local_2f0 < 50.0) ||
           (uVar16 = 0xffffffff, uVar10 == *(int *)(pMVar11 + 8) - 1U)) {
          uVar16 = uVar10;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      if (iVar5 == -1) {
        local_2f0._4_4_ = *(int *)(pMVar11 + 8) + iVar15 + 1;
        local_2f0._0_4_ = *(int *)(pMVar11 + 8) + iVar15;
        local_368.start = -0x80000000;
        local_368.end = 0x7fffffff;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar11,(Range *)&local_2f0,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        local_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_2f0);
        if (50.0 <= (double)local_2f0) {
          iVar12 = *(int *)(pMVar11 + 8);
          iVar5 = -1;
          if (uVar10 == iVar12 - 1U) goto LAB_00109cb6;
        }
        else {
          iVar12 = *(int *)(pMVar11 + 8);
LAB_00109cb6:
          iVar5 = iVar12 + iVar15;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      if (local_39c == 0xffffffff) {
        local_2f0._0_4_ = -0x80000000;
        local_2f0._4_4_ = 0x7fffffff;
        local_368.end = uVar10 + 1;
        local_368.start = uVar10;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar11,(Range *)&local_2f0,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        local_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_2f0);
        if (((double)local_2f0 < 50.0) ||
           (local_39c = 0xffffffff, uVar10 == *(int *)(pMVar11 + 0xc) - 1U)) {
          local_39c = uVar10;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      if ((int)local_388 == -1) {
        local_368.start = *(int *)(pMVar11 + 0xc) + iVar15;
        local_2f0._0_4_ = -0x80000000;
        local_2f0._4_4_ = 0x7fffffff;
        local_368.end = *(int *)(pMVar11 + 0xc) + iVar15 + 1;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar11,(Range *)&local_2f0,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        local_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_2f0);
        if (50.0 <= (double)local_2f0) {
          iVar12 = *(int *)(pMVar11 + 0xc);
          local_388._0_4_ = -1;
          if (uVar10 == iVar12 - 1U) goto LAB_00109e49;
        }
        else {
          iVar12 = *(int *)(pMVar11 + 0xc);
LAB_00109e49:
          local_388._0_4_ = iVar12 + iVar15;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      uVar10 = uVar10 + 1;
      iVar15 = iVar15 + -1;
    } while ((int)uVar10 < *(int *)(pMVar11 + 8));
  }
  cv::Mat::Mat((Mat *)&local_2f0);
  cv::Mat::zeros((int)&local_1a8,*(int *)(pMVar11 + 8),*(int *)(pMVar11 + 0xc));
  (**(code **)(*(long *)CONCAT44(uStack_1a4,local_1a8) + 0x18))
            ((long *)CONCAT44(uStack_1a4,local_1a8),&local_1a8,&local_2f0,0xffffffff);
  cv::Mat::~Mat(local_d8);
  cv::Mat::~Mat(local_138);
  cv::Mat::~Mat((Mat *)local_198);
  iVar12 = local_2e8 / 2;
  iVar15 = (int)(uVar16 - iVar5) / 2;
  if (iVar12 - iVar15 < iVar12 + iVar15) {
    iVar7 = (int)(local_39c - (int)local_388) / 2;
    iVar6 = local_2e4 / 2 - iVar7;
    lVar13 = (long)-iVar15 + (long)iVar12;
    do {
      if (iVar6 < local_2e4 / 2 + iVar7) {
        lVar1 = *local_2a8;
        lVar17 = (long)iVar6;
        iVar14 = (int)local_388;
        do {
          *(undefined1 *)(lVar1 * lVar13 + (long)local_2e0 + lVar17) =
               *(undefined1 *)
                ((long)iVar14 +
                **(long **)(pMVar11 + 0x48) * (long)((iVar5 - (iVar12 - iVar15)) + (int)lVar13) +
                *(long *)(pMVar11 + 0x10));
          lVar17 = lVar17 + 1;
          iVar14 = iVar14 + 1;
        } while (lVar17 < local_2e4 / 2 + iVar7);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < local_2e8 / 2 + iVar15);
  }
  cv::Mat::Mat(img,numCols,in_ECX,0);
  local_198[0] = 0;
  local_1a8 = 0x1010000;
  local_358 = 0;
  local_368.start = 0x2010000;
  local_360 = img;
  local_280 = numCols;
  local_1a0 = (_InputArray *)&local_2f0;
  cv::resize(0,0);
  cv::Mat::clone();
  local_278[0].obj = local_308;
  local_388 = 0;
  pvStack_380 = (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 *)0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (pointer)0x0;
  local_358 = 0;
  local_368.start = 0x1010000;
  local_278[0].sz.width = 0;
  local_278[0].sz.height = 0;
  local_278[0].flags = -0x7dfbfff4;
  local_288 = 0;
  local_360 = img;
  cv::findContours(&local_368,local_278,1);
  if (local_308._8_8_ != local_308._0_8_) {
    local_388 = 0;
    pvStack_380 = (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   *)0x0;
    dVar3 = 0.0;
    uVar8 = 0;
    uVar9 = 1;
    do {
      local_360 = (Mat *)(local_308._0_8_ + uVar8 * 0x18);
      local_358 = 0;
      local_368.start = -0x7efcfff4;
      cv::boundingRect(local_278);
      dVar2 = (double)((int)((ulong)local_278[0].obj >> 0x20) * (int)local_278[0].obj);
      if (dVar3 < dVar2) {
        local_388 = CONCAT44(local_278[0]._4_4_,local_278[0].flags);
        pvStack_380 = (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       *)local_278[0].obj;
        dVar3 = dVar2;
      }
      uVar8 = ((long)(local_308._8_8_ - local_308._0_8_) >> 3) * -0x5555555555555555;
      bVar18 = uVar9 <= uVar8;
      lVar13 = uVar8 - uVar9;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar18 && lVar13 != 0);
  }
  local_1b8 = local_388;
  pvStack_1b0 = pvStack_380;
  cv::Mat::Mat((Mat *)&local_368,(Mat *)&local_1a8,(Rect_ *)&local_1b8);
  cVar4 = cv::Mat::empty();
  if (cVar4 == '\0') {
    local_278[0].sz.width = 0;
    local_278[0].sz.height = 0;
    local_278[0].flags = 0x1010000;
    local_38 = 0;
    local_48 = 0x2010000;
    local_290 = numCols;
    local_278[0].obj = &local_368;
    local_40 = img;
    cv::resize(0,0);
  }
  local_278[0].sz.width = 0;
  local_278[0].sz.height = 0;
  local_278[0].flags = 0x2010000;
  local_278[0].obj = img;
  cv::Mat::convertTo((_OutputArray *)img,(int)local_278,0.00392156862745098,0.0);
  cv::Mat::reshape((int)local_278,(int)img);
  cv::Mat::operator=(img,(Mat *)local_278);
  cv::Mat::~Mat((Mat *)local_278);
  cv::Mat::~Mat((Mat *)&local_368);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_308);
  cv::Mat::~Mat((Mat *)&local_1a8);
  cv::Mat::~Mat((Mat *)&local_2f0);
  cv::Mat::~Mat(local_218);
  return img;
}

Assistant:

Mat preprocessImage(Mat img, int numRows, int numCols)
{

    
    int rowTop=-1, rowBottom=-1, colLeft=-1, colRight=-1;

    Mat temp;
    int thresholdBottom = 50;
    int thresholdTop = 50;
    int thresholdLeft = 50;
    int thresholdRight = 50;
    int center = img.rows/2;
    for(int i=center;i<img.rows;i++){
        if(rowBottom==-1)
        {
            temp = img.row(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdBottom || i==img.rows-1)
                rowBottom = i;

        }

        if(rowTop==-1)
        {
            temp = img.row(img.rows-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdTop || i==img.rows-1)
                rowTop = img.rows-i;

        }
        if(colRight==-1)
        {
            temp = img.col(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdRight|| i==img.cols-1)
                colRight = i;

        }

        if(colLeft==-1)
        {
            temp = img.col(img.cols-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdLeft|| i==img.cols-1)
                colLeft = img.cols-i;
        }
    }
    Mat newImg;
    //newImg = img.clone();

    newImg = newImg.zeros(img.rows, img.cols, CV_8UC1);

    int startAtX = (newImg.cols/2)-(colRight-colLeft)/2;

    int startAtY = (newImg.rows/2)-(rowBottom-rowTop)/2;

    for(int y=startAtY;y<(newImg.rows/2)+(rowBottom-rowTop)/2;y++)
    {
        uchar *ptr = newImg.ptr<uchar>(y);
        for(int x=startAtX;x<(newImg.cols/2)+(colRight-colLeft)/2;x++)
        {
            ptr[x] = img.at<uchar>(rowTop+(y-startAtY),colLeft+(x-startAtX));
        }
    }
    Mat cloneImg = Mat(numRows, numCols, CV_8UC1);
    resize(newImg, cloneImg, Size(numRows, numCols), 0, 0 , INTER_NEAREST);
    // Now fill along the borders
    /*for(int i=0;i<cloneImg.rows;i++)
    {
        floodFill(cloneImg, Point(0, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(cloneImg.cols-1, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(i, 0), Scalar(0));
        floodFill(cloneImg, Point(i, cloneImg.rows-1), Scalar(0));
    }*/
    Mat realClone = cloneImg.clone();
    vector<vector<Point>> countours;
    findContours(cloneImg, countours, RETR_LIST, CHAIN_APPROX_SIMPLE);
    Rect prevb; double areaprev = 0; double area; 
    for(unsigned int i = 0; i<countours.size();i++){
        Rect bnd = boundingRect(countours[i]);
        area = bnd.height*bnd.width;
        if(area > areaprev){
            prevb = bnd;
            areaprev = area;
        }
    }
    Rect rec = prevb;
    Mat region = realClone(rec);
    if(!region.empty())
        resize(region, cloneImg, Size(numRows, numCols), 0, 0, INTER_NEAREST);   

    cloneImg.convertTo(cloneImg, CV_32FC1, 1.0/255.0 );
    //imshow("clone img", cloneImg);
    //waitKey(0);
    cloneImg = cloneImg.reshape(1,1);
    return cloneImg;
}